

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonObjectCompute(sqlite3_context *ctx,int isFinal)

{
  byte *pbVar1;
  int n;
  Mem *pMVar2;
  JsonString *p;
  
  if ((short)ctx->pMem->flags < 0) {
    p = (JsonString *)ctx->pMem->z;
  }
  else {
    p = (JsonString *)createAggContext(ctx,0);
  }
  if (p == (JsonString *)0x0) {
    setResultStrOrError(ctx,"{}",2,'\x01',(_func_void_void_ptr *)0x0);
  }
  else {
    jsonAppendChar(p,'}');
    if (p->bErr == '\0') {
      n = (int)p->nUsed;
      if (isFinal == 0) {
        setResultStrOrError(ctx,p->zBuf,n,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        p->nUsed = p->nUsed - 1;
      }
      else {
        setResultStrOrError(ctx,p->zBuf,n,'\x01',
                            (_func_void_void_ptr *)
                            (-(ulong)(p->bStatic != '\0') | (ulong)sqlite3_free));
        p->bStatic = '\x01';
      }
    }
    else if (p->bErr == '\x01') {
      sqlite3_result_error_nomem(ctx);
    }
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

static void jsonObjectCompute(sqlite3_context *ctx, int isFinal){
  JsonString *pStr;
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
  if( pStr ){
    jsonAppendChar(pStr, '}');
    if( pStr->bErr ){
      if( pStr->bErr==1 ) sqlite3_result_error_nomem(ctx);
      assert( pStr->bStatic );
    }else if( isFinal ){
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed,
                          pStr->bStatic ? SQLITE_TRANSIENT : sqlite3_free);
      pStr->bStatic = 1;
    }else{
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed, SQLITE_TRANSIENT);
      pStr->nUsed--;
    }
  }else{
    sqlite3_result_text(ctx, "{}", 2, SQLITE_STATIC);
  }
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}